

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int decompose_f5_ext_stem_d2
              (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
              default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  int *stems_00;
  int local_44;
  int *stems;
  int e;
  sc_wrapper_f5 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int j_local;
  vrna_fold_compound_t *fc_local;
  
  stems_00 = get_stem_contributions_d2(fc,j,evaluate,hc_dat_local,sc_wrapper);
  local_44 = decompose_f5_ext_stem(fc,j,stems_00);
  if (stems_00[1] <= local_44) {
    local_44 = stems_00[1];
  }
  free(stems_00);
  return local_44;
}

Assistant:

int
decompose_f5_ext_stem_d2(vrna_fold_compound_t       *fc,
                         int                        j,
                         vrna_callback_hc_evaluate  *evaluate,
                         struct default_data        *hc_dat_local,
                         struct sc_wrapper_f5       *sc_wrapper)
{
  int e, *stems;

  stems = get_stem_contributions_d2(fc, j, evaluate, hc_dat_local, sc_wrapper);

  /* 1st case, actual decompostion */
  e = decompose_f5_ext_stem(fc, j, stems);

  /* 2nd case, reduce to single stem */
  e = MIN2(e, stems[1]);

  free(stems);

  return e;
}